

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

RefAST __thiscall
antlr::ASTFactory::make
          (ASTFactory *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *nodes)

{
  _func_int **pp_Var1;
  ASTRefCount<antlr::AST> *other;
  ASTRef *pAVar2;
  long lVar3;
  long *in_RDX;
  ulong uVar4;
  _func_int *p_Var5;
  AST *pAVar6;
  RefAST tail;
  ASTRefCount<antlr::AST> local_58;
  ASTRefCount<antlr::AST> local_50;
  ASTRefCount<antlr::AST> local_48;
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38;
  
  if ((long *)in_RDX[1] == (long *)*in_RDX) {
    this->_vptr_ASTFactory = (_func_int **)0x0;
  }
  else {
    pp_Var1 = *(_func_int ***)*in_RDX;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var1 = (_func_int **)0x0;
    }
    else {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    }
    this->_vptr_ASTFactory = pp_Var1;
    local_58.ref = (ASTRef *)0x0;
    pp_Var1 = this->_vptr_ASTFactory;
    if ((pp_Var1 != (_func_int **)0x0) && (*pp_Var1 != (_func_int *)0x0)) {
      if (pp_Var1 == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x0;
      }
      else {
        p_Var5 = *pp_Var1;
      }
      local_58.ref = (ASTRef *)0x0;
      local_40.ref = (ASTRef *)0x0;
      (**(code **)(*(long *)p_Var5 + 0xa0))(p_Var5);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
    }
    lVar3 = *in_RDX;
    if (8 < (ulong)(in_RDX[1] - lVar3)) {
      uVar4 = 1;
      do {
        pAVar2 = *(ASTRef **)(lVar3 + uVar4 * 8);
        if ((pAVar2 != (ASTRef *)0x0) && (pAVar2->ptr != (AST *)0x0)) {
          pp_Var1 = this->_vptr_ASTFactory;
          if ((pp_Var1 == (_func_int **)0x0) || (*pp_Var1 == (_func_int *)0x0)) {
            other = ASTRefCount<antlr::AST>::operator=
                              (&local_58,(ASTRefCount<antlr::AST> *)(lVar3 + uVar4 * 8));
            ASTRefCount<antlr::AST>::operator=((ASTRefCount<antlr::AST> *)this,other);
          }
          else {
            if ((local_58.ref == (ASTRef *)0x0) || ((local_58.ref)->ptr == (AST *)0x0)) {
              if (pp_Var1 == (_func_int **)0x0) {
                p_Var5 = (_func_int *)0x0;
              }
              else {
                p_Var5 = *pp_Var1;
              }
              if (pAVar2 == (ASTRef *)0x0) {
                pAVar2 = (ASTRef *)0x0;
              }
              else {
                pAVar2->count = pAVar2->count + 1;
              }
              local_48.ref = pAVar2;
              (**(code **)(*(long *)p_Var5 + 0xa0))(p_Var5,&local_48);
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_48);
              (**(code **)(*(long *)*this->_vptr_ASTFactory + 0x68))(&local_38);
            }
            else {
              if (local_58.ref == (ASTRef *)0x0) {
                pAVar6 = (AST *)0x0;
              }
              else {
                pAVar6 = (local_58.ref)->ptr;
              }
              if (pAVar2 == (ASTRef *)0x0) {
                pAVar2 = (ASTRef *)0x0;
              }
              else {
                pAVar2->count = pAVar2->count + 1;
              }
              local_50.ref = pAVar2;
              (*pAVar6->_vptr_AST[0x15])(pAVar6,&local_50);
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_50);
              (*(local_58.ref)->ptr->_vptr_AST[0xe])(&local_38);
            }
            ASTRefCount<antlr::AST>::operator=(&local_58,&local_38);
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
          }
          if ((local_58.ref != (ASTRef *)0x0) && ((local_58.ref)->ptr != (AST *)0x0)) {
            while ((*(local_58.ref)->ptr->_vptr_AST[0xe])(&local_38), local_38.ref != (ASTRef *)0x0)
            {
              pAVar6 = (local_38.ref)->ptr;
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
              if (pAVar6 == (AST *)0x0) goto LAB_0016646b;
              (*(local_58.ref)->ptr->_vptr_AST[0xe])(&local_38);
              ASTRefCount<antlr::AST>::operator=(&local_58,&local_38);
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
            }
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
          }
        }
LAB_0016646b:
        uVar4 = (ulong)((int)uVar4 + 1);
        lVar3 = *in_RDX;
      } while (uVar4 < (ulong)(in_RDX[1] - lVar3 >> 3));
    }
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_58);
  }
  return (RefAST)(ASTRef *)this;
}

Assistant:

RefAST ASTFactory::make(ANTLR_USE_NAMESPACE(std)vector<RefAST>& nodes)
{
	if ( nodes.size() == 0 )
		return RefAST(nullASTptr);

	RefAST root = nodes[0];
	RefAST tail = RefAST(nullASTptr);

	if( root )
		root->setFirstChild(RefAST(nullASTptr));	// don't leave any old pointers set

	// link in children;
	for( unsigned int i = 1; i < nodes.size(); i++ )
	{
		if ( nodes[i] == 0 )		// ignore null nodes
			continue;

		if ( root == 0 )			// Set the root and set it up for a flat list
			root = tail = nodes[i];
		else if ( tail == 0 )
		{
			root->setFirstChild(nodes[i]);
			tail = root->getFirstChild();
		}
		else
		{
			tail->setNextSibling(nodes[i]);
			tail = tail->getNextSibling();
		}

		if( tail )	// RK: I cannot fathom why this missing check didn't bite anyone else...
		{
			// Chase tail to last sibling
			while (tail->getNextSibling())
				tail = tail->getNextSibling();
		}
	}

	return root;
}